

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::stop(ThreadPool *this)

{
  bool bVar1;
  mutex *in_RDI;
  iterator thread;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  in_stack_ffffffffffffffc0;
  
  clear((ThreadPool *)in_stack_ffffffffffffffc0._M_current);
  bVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::empty
                    ((vector<std::thread,_std::allocator<std::thread>_> *)
                     in_stack_ffffffffffffffc0._M_current);
  if (!bVar1) {
    std::mutex::lock(in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa8);
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8,(int *)in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa8);
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8,(int *)in_RDI);
    std::condition_variable::notify_all();
    std::mutex::unlock((mutex *)0x13bd3e);
    std::vector<std::thread,_std::allocator<std::thread>_>::begin(in_stack_ffffffffffffffa8);
    while( true ) {
      std::vector<std::thread,_std::allocator<std::thread>_>::end(in_stack_ffffffffffffffa8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                          *)in_RDI,
                         (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator->((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                  *)&stack0xffffffffffffffc0);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                  *)&stack0xffffffffffffffc0);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x13bd99);
  }
  return;
}

Assistant:

void ThreadPool::stop()
{
    clear();

    if( !_worker.empty() ) {
        _taskInfo.lock();

        std::fill( _exit.begin(), _exit.end(), 1 );
        std::fill( _run.begin(), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        for( std::vector < std::thread >::iterator thread = _worker.begin(); thread != _worker.end(); ++thread )
            thread->join();

        _worker.clear();
    }
}